

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_io.c
# Opt level: O1

int cram_set_voption(cram_fd *fd,cram_option opt,__va_list_tag *args)

{
  cram_range *r;
  uint uVar1;
  refs_t *prVar2;
  refs_t *r_00;
  undefined8 uVar3;
  int iVar4;
  undefined8 *puVar5;
  long *plVar6;
  int *piVar7;
  uint *puVar8;
  t_pool *ptVar9;
  t_results_queue *ptVar10;
  char *pcVar11;
  int minor;
  int major;
  uint local_20;
  int local_1c;
  
  iVar4 = -1;
  if (fd != (cram_fd *)0x0) {
    switch(opt) {
    case CRAM_OPT_DECODE_MD:
      uVar1 = args->gp_offset;
      if ((ulong)uVar1 < 0x29) {
        piVar7 = (int *)((ulong)uVar1 + (long)args->reg_save_area);
        args->gp_offset = uVar1 + 8;
      }
      else {
        piVar7 = (int *)args->overflow_arg_area;
        args->overflow_arg_area = piVar7 + 2;
      }
      fd->decode_md = *piVar7;
      break;
    case CRAM_OPT_PREFIX:
      if (fd->prefix != (char *)0x0) {
        free(fd->prefix);
      }
      uVar1 = args->gp_offset;
      if ((ulong)uVar1 < 0x29) {
        puVar5 = (undefined8 *)((ulong)uVar1 + (long)args->reg_save_area);
        args->gp_offset = uVar1 + 8;
      }
      else {
        puVar5 = (undefined8 *)args->overflow_arg_area;
        args->overflow_arg_area = puVar5 + 1;
      }
      pcVar11 = strdup((char *)*puVar5);
      fd->prefix = pcVar11;
      if (pcVar11 == (char *)0x0) {
        return -1;
      }
      break;
    case CRAM_OPT_VERBOSITY:
      uVar1 = args->gp_offset;
      if ((ulong)uVar1 < 0x29) {
        piVar7 = (int *)((ulong)uVar1 + (long)args->reg_save_area);
        args->gp_offset = uVar1 + 8;
      }
      else {
        piVar7 = (int *)args->overflow_arg_area;
        args->overflow_arg_area = piVar7 + 2;
      }
      fd->verbose = *piVar7;
      break;
    case CRAM_OPT_SEQS_PER_SLICE:
      uVar1 = args->gp_offset;
      if ((ulong)uVar1 < 0x29) {
        piVar7 = (int *)((ulong)uVar1 + (long)args->reg_save_area);
        args->gp_offset = uVar1 + 8;
      }
      else {
        piVar7 = (int *)args->overflow_arg_area;
        args->overflow_arg_area = piVar7 + 2;
      }
      fd->seqs_per_slice = *piVar7;
      break;
    case CRAM_OPT_SLICES_PER_CONTAINER:
      uVar1 = args->gp_offset;
      if ((ulong)uVar1 < 0x29) {
        piVar7 = (int *)((ulong)uVar1 + (long)args->reg_save_area);
        args->gp_offset = uVar1 + 8;
      }
      else {
        piVar7 = (int *)args->overflow_arg_area;
        args->overflow_arg_area = piVar7 + 2;
      }
      fd->slices_per_container = *piVar7;
      break;
    case CRAM_OPT_RANGE:
      r = &fd->range;
      uVar1 = args->gp_offset;
      if ((ulong)uVar1 < 0x29) {
        plVar6 = (long *)((ulong)uVar1 + (long)args->reg_save_area);
        args->gp_offset = uVar1 + 8;
      }
      else {
        plVar6 = (long *)args->overflow_arg_area;
        args->overflow_arg_area = plVar6 + 1;
      }
      puVar5 = (undefined8 *)*plVar6;
      (fd->range).end = *(int *)(puVar5 + 1);
      uVar3 = *puVar5;
      r->refid = (int)uVar3;
      r->start = (int)((ulong)uVar3 >> 0x20);
      iVar4 = cram_seek_to_refpos(fd,r);
      return iVar4;
    case CRAM_OPT_VERSION:
      uVar1 = args->gp_offset;
      if ((ulong)uVar1 < 0x29) {
        puVar5 = (undefined8 *)((ulong)uVar1 + (long)args->reg_save_area);
        args->gp_offset = uVar1 + 8;
      }
      else {
        puVar5 = (undefined8 *)args->overflow_arg_area;
        args->overflow_arg_area = puVar5 + 1;
      }
      uVar3 = *puVar5;
      iVar4 = __isoc99_sscanf(uVar3,"%d.%d",&local_1c,&local_20);
      if (iVar4 != 2) {
        fprintf(_stderr,"Malformed version string %s\n",uVar3);
        return -1;
      }
      if (local_1c != 1 || local_20 != 0) {
        if ((local_1c != 2 || 1 < local_20) && (local_1c != 3 || local_20 != 0)) {
          cram_set_voption_cold_1();
          return -1;
        }
      }
      iVar4 = local_1c * 0x100 + local_20;
      fd->version = iVar4;
      if (0x2ff < iVar4) {
        fd->use_rans = 1;
      }
      break;
    case CRAM_OPT_EMBED_REF:
      uVar1 = args->gp_offset;
      if ((ulong)uVar1 < 0x29) {
        piVar7 = (int *)((ulong)uVar1 + (long)args->reg_save_area);
        args->gp_offset = uVar1 + 8;
      }
      else {
        piVar7 = (int *)args->overflow_arg_area;
        args->overflow_arg_area = piVar7 + 2;
      }
      fd->embed_ref = *piVar7;
      break;
    case CRAM_OPT_IGNORE_MD5:
      uVar1 = args->gp_offset;
      if ((ulong)uVar1 < 0x29) {
        piVar7 = (int *)((ulong)uVar1 + (long)args->reg_save_area);
        args->gp_offset = uVar1 + 8;
      }
      else {
        piVar7 = (int *)args->overflow_arg_area;
        args->overflow_arg_area = piVar7 + 2;
      }
      fd->ignore_md5 = *piVar7;
      break;
    case CRAM_OPT_REFERENCE:
      uVar1 = args->gp_offset;
      if ((ulong)uVar1 < 0x29) {
        puVar5 = (undefined8 *)((ulong)uVar1 + (long)args->reg_save_area);
        args->gp_offset = uVar1 + 8;
      }
      else {
        puVar5 = (undefined8 *)args->overflow_arg_area;
        args->overflow_arg_area = puVar5 + 1;
      }
      iVar4 = cram_load_reference(fd,(char *)*puVar5);
      return iVar4;
    case CRAM_OPT_MULTI_SEQ_PER_SLICE:
      uVar1 = args->gp_offset;
      if ((ulong)uVar1 < 0x29) {
        piVar7 = (int *)((ulong)uVar1 + (long)args->reg_save_area);
        args->gp_offset = uVar1 + 8;
      }
      else {
        piVar7 = (int *)args->overflow_arg_area;
        args->overflow_arg_area = piVar7 + 2;
      }
      fd->multi_seq = *piVar7;
      break;
    case CRAM_OPT_NO_REF:
      uVar1 = args->gp_offset;
      if ((ulong)uVar1 < 0x29) {
        piVar7 = (int *)((ulong)uVar1 + (long)args->reg_save_area);
        args->gp_offset = uVar1 + 8;
      }
      else {
        piVar7 = (int *)args->overflow_arg_area;
        args->overflow_arg_area = piVar7 + 2;
      }
      fd->no_ref = *piVar7;
      break;
    case CRAM_OPT_USE_BZIP2:
      uVar1 = args->gp_offset;
      if ((ulong)uVar1 < 0x29) {
        piVar7 = (int *)((ulong)uVar1 + (long)args->reg_save_area);
        args->gp_offset = uVar1 + 8;
      }
      else {
        piVar7 = (int *)args->overflow_arg_area;
        args->overflow_arg_area = piVar7 + 2;
      }
      fd->use_bz2 = *piVar7;
      break;
    case CRAM_OPT_SHARED_REF:
      fd->shared_ref = 1;
      uVar1 = args->gp_offset;
      if ((ulong)uVar1 < 0x29) {
        plVar6 = (long *)((ulong)uVar1 + (long)args->reg_save_area);
        args->gp_offset = uVar1 + 8;
      }
      else {
        plVar6 = (long *)args->overflow_arg_area;
        args->overflow_arg_area = plVar6 + 1;
      }
      prVar2 = (refs_t *)*plVar6;
      r_00 = fd->refs;
      if (prVar2 != r_00) {
        if (r_00 != (refs_t *)0x0) {
          refs_free(r_00);
        }
        fd->refs = prVar2;
        prVar2->count = prVar2->count + 1;
      }
      break;
    case CRAM_OPT_NTHREADS:
      uVar1 = args->gp_offset;
      if ((ulong)uVar1 < 0x29) {
        piVar7 = (int *)((ulong)uVar1 + (long)args->reg_save_area);
        args->gp_offset = uVar1 + 8;
      }
      else {
        piVar7 = (int *)args->overflow_arg_area;
        args->overflow_arg_area = piVar7 + 2;
      }
      iVar4 = *piVar7;
      if (1 < iVar4) {
        ptVar9 = t_pool_init(iVar4 * 2,iVar4);
        fd->pool = ptVar9;
        if (ptVar9 == (t_pool *)0x0) {
          return -1;
        }
        ptVar10 = t_results_queue_init();
        fd->rqueue = ptVar10;
        pthread_mutex_init((pthread_mutex_t *)&fd->metrics_lock,(pthread_mutexattr_t *)0x0);
        pthread_mutex_init((pthread_mutex_t *)&fd->ref_lock,(pthread_mutexattr_t *)0x0);
        pthread_mutex_init((pthread_mutex_t *)&fd->bam_list_lock,(pthread_mutexattr_t *)0x0);
        fd->shared_ref = 1;
        fd->own_pool = 1;
      }
      break;
    case CRAM_OPT_THREAD_POOL:
      uVar1 = args->gp_offset;
      if ((ulong)uVar1 < 0x29) {
        plVar6 = (long *)((ulong)uVar1 + (long)args->reg_save_area);
        args->gp_offset = uVar1 + 8;
      }
      else {
        plVar6 = (long *)args->overflow_arg_area;
        args->overflow_arg_area = plVar6 + 1;
      }
      ptVar9 = (t_pool *)*plVar6;
      fd->pool = ptVar9;
      if (ptVar9 != (t_pool *)0x0) {
        ptVar10 = t_results_queue_init();
        fd->rqueue = ptVar10;
        pthread_mutex_init((pthread_mutex_t *)&fd->metrics_lock,(pthread_mutexattr_t *)0x0);
        pthread_mutex_init((pthread_mutex_t *)&fd->ref_lock,(pthread_mutexattr_t *)0x0);
        pthread_mutex_init((pthread_mutex_t *)&fd->bam_list_lock,(pthread_mutexattr_t *)0x0);
      }
      fd->shared_ref = 1;
      fd->own_pool = 0;
      break;
    case CRAM_OPT_USE_LZMA:
      uVar1 = args->gp_offset;
      if ((ulong)uVar1 < 0x29) {
        piVar7 = (int *)((ulong)uVar1 + (long)args->reg_save_area);
        args->gp_offset = uVar1 + 8;
      }
      else {
        piVar7 = (int *)args->overflow_arg_area;
        args->overflow_arg_area = piVar7 + 2;
      }
      fd->use_lzma = *piVar7;
      break;
    case CRAM_OPT_USE_RANS:
      uVar1 = args->gp_offset;
      if ((ulong)uVar1 < 0x29) {
        piVar7 = (int *)((ulong)uVar1 + (long)args->reg_save_area);
        args->gp_offset = uVar1 + 8;
      }
      else {
        piVar7 = (int *)args->overflow_arg_area;
        args->overflow_arg_area = piVar7 + 2;
      }
      fd->use_rans = *piVar7;
      break;
    case CRAM_OPT_REQUIRED_FIELDS:
      uVar1 = args->gp_offset;
      if ((ulong)uVar1 < 0x29) {
        puVar8 = (uint *)((ulong)uVar1 + (long)args->reg_save_area);
        args->gp_offset = uVar1 + 8;
      }
      else {
        puVar8 = (uint *)args->overflow_arg_area;
        args->overflow_arg_area = puVar8 + 2;
      }
      fd->required_fields = *puVar8;
      break;
    default:
      fprintf(_stderr,"Unknown CRAM option code %d\n");
      return -1;
    }
    iVar4 = 0;
  }
  return iVar4;
}

Assistant:

int cram_set_voption(cram_fd *fd, enum cram_option opt, va_list args) {
    refs_t *refs;

    if (!fd)
	return -1;

    switch (opt) {
    case CRAM_OPT_DECODE_MD:
	fd->decode_md = va_arg(args, int);
	break;

    case CRAM_OPT_PREFIX:
	if (fd->prefix)
	    free(fd->prefix);
	if (!(fd->prefix = strdup(va_arg(args, char *))))
	    return -1;
	break;

    case CRAM_OPT_VERBOSITY:
	fd->verbose = va_arg(args, int);
	break;

    case CRAM_OPT_SEQS_PER_SLICE:
	fd->seqs_per_slice = va_arg(args, int);
	break;

    case CRAM_OPT_SLICES_PER_CONTAINER:
	fd->slices_per_container = va_arg(args, int);
	break;

    case CRAM_OPT_EMBED_REF:
	fd->embed_ref = va_arg(args, int);
	break;

    case CRAM_OPT_NO_REF:
	fd->no_ref = va_arg(args, int);
	break;

    case CRAM_OPT_IGNORE_MD5:
	fd->ignore_md5 = va_arg(args, int);
	break;

    case CRAM_OPT_USE_BZIP2:
	fd->use_bz2 = va_arg(args, int);
	break;

    case CRAM_OPT_USE_RANS:
	fd->use_rans = va_arg(args, int);
	break;

    case CRAM_OPT_USE_LZMA:
	fd->use_lzma = va_arg(args, int);
	break;

    case CRAM_OPT_SHARED_REF:
	fd->shared_ref = 1;
	refs = va_arg(args, refs_t *);
	if (refs != fd->refs) {
	    if (fd->refs)
		refs_free(fd->refs);
	    fd->refs = refs;
	    fd->refs->count++;
	}
	break;

    case CRAM_OPT_RANGE:
	fd->range = *va_arg(args, cram_range *);
	return cram_seek_to_refpos(fd, &fd->range);

    case CRAM_OPT_REFERENCE:
	return cram_load_reference(fd, va_arg(args, char *));

    case CRAM_OPT_VERSION: {
	int major, minor;
	char *s = va_arg(args, char *);
	if (2 != sscanf(s, "%d.%d", &major, &minor)) {
	    fprintf(stderr, "Malformed version string %s\n", s);
	    return -1;
	}
	if (!((major == 1 &&  minor == 0) ||
	      (major == 2 && (minor == 0 || minor == 1)) ||
	      (major == 3 &&  minor == 0))) {
	    fprintf(stderr, "Unknown version string; "
		    "use 1.0, 2.0, 2.1 or 3.0\n");
	    return -1;
	}
	fd->version = major*256 + minor;

	if (CRAM_MAJOR_VERS(fd->version) >= 3)
	    fd->use_rans = 1;
	break;
    }

    case CRAM_OPT_MULTI_SEQ_PER_SLICE:
	fd->multi_seq = va_arg(args, int);
	break;

    case CRAM_OPT_NTHREADS: {
	int nthreads =  va_arg(args, int);
        if (nthreads > 1) {
            if (!(fd->pool = t_pool_init(nthreads*2, nthreads)))
                return -1;

	    fd->rqueue = t_results_queue_init();
	    pthread_mutex_init(&fd->metrics_lock, NULL);
	    pthread_mutex_init(&fd->ref_lock, NULL);
	    pthread_mutex_init(&fd->bam_list_lock, NULL);
	    fd->shared_ref = 1;
	    fd->own_pool = 1;
        }
	break;
    }

    case CRAM_OPT_THREAD_POOL:
	fd->pool = va_arg(args, t_pool *);
	if (fd->pool) {
	    fd->rqueue = t_results_queue_init();
	    pthread_mutex_init(&fd->metrics_lock, NULL);
	    pthread_mutex_init(&fd->ref_lock, NULL);
	    pthread_mutex_init(&fd->bam_list_lock, NULL);
	}
	fd->shared_ref = 1; // Needed to avoid clobbering ref between threads
	fd->own_pool = 0;

	//fd->qsize = 1;
	//fd->decoded = calloc(fd->qsize, sizeof(cram_container *));
	//t_pool_dispatch(fd->pool, cram_decoder_thread, fd);
	break;

    case CRAM_OPT_REQUIRED_FIELDS:
	fd->required_fields = va_arg(args, int);
	break;

    default:
	fprintf(stderr, "Unknown CRAM option code %d\n", opt);
	return -1;
    }

    return 0;
}